

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# managed_buffer.cpp
# Opt level: O1

void __thiscall
polyscope::render::ManagedBuffer<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_>::
recomputeIfPopulated(ManagedBuffer<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_> *this)

{
  vector<glm::vec<4,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_>_>
  *pvVar1;
  pointer pvVar2;
  CanonicalDataSource CVar3;
  string local_38;
  
  if (this->dataGetsComputed == false) {
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_38,
               "called recomputeIfPopulated() on buffer which does not get computed","");
    exception(&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p);
    }
  }
  CVar3 = currentCanonicalDataSource(this);
  if (CVar3 != NeedsCompute) {
    this->hostBufferIsPopulated = false;
    pvVar1 = this->data;
    pvVar2 = (pvVar1->
             super__Vector_base<glm::vec<4,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((pvVar1->
        super__Vector_base<glm::vec<4,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_>_>
        )._M_impl.super__Vector_impl_data._M_finish != pvVar2) {
      (pvVar1->
      super__Vector_base<glm::vec<4,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_>_>
      )._M_impl.super__Vector_impl_data._M_finish = pvVar2;
    }
    if ((this->computeFunc).super__Function_base._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*(this->computeFunc)._M_invoker)((_Any_data *)&this->computeFunc);
    markHostBufferUpdated(this);
  }
  return;
}

Assistant:

void ManagedBuffer<T>::recomputeIfPopulated() {
  if (!dataGetsComputed) { // sanity check
    exception("called recomputeIfPopulated() on buffer which does not get computed");
  }

  // if not populated, quick out
  if (currentCanonicalDataSource() == CanonicalDataSource::NeedsCompute) {
    return;
  }

  invalidateHostBuffer();
  computeFunc();
  markHostBufferUpdated();
}